

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O1

Qiniu_Error Qiniu_Mac_Auth(void *self,Qiniu_Header **header,char *url,char *addition,size_t addlen)

{
  char *addr;
  char *addr_00;
  Qiniu_Header *pQVar1;
  Qiniu_Error QVar2;
  uint digest_len;
  Qiniu_Mac mac;
  char *path;
  char *items [1];
  char digest [65];
  uint local_9c;
  Qiniu_Mac local_98;
  char *local_88;
  char *local_80;
  char local_78 [72];
  
  local_9c = 0x41;
  QVar2 = Qiniu_Mac_Parse_Url(url,(char **)0x0,(size_t *)0x0,&local_88,(size_t *)addlen);
  if (QVar2.code == 200) {
    if (self == (void *)0x0) {
      local_98.accessKey = QINIU_ACCESS_KEY;
      local_98.secretKey = QINIU_SECRET_KEY;
    }
    else {
      local_98.accessKey = *self;
      local_98.secretKey = *(char **)((long)self + 8);
    }
    local_80 = local_88;
    Qiniu_Mac_Hmac_inner(&local_98,&local_80,1,addition,addlen,local_78,&local_9c);
    addr = Qiniu_Memory_Encode(local_78,(ulong)local_9c);
    addr_00 = Qiniu_String_Concat("Authorization: QBox ",local_98.accessKey,":",addr,0);
    Qiniu_Free(addr);
    pQVar1 = (Qiniu_Header *)curl_slist_append(*header,addr_00);
    *header = pQVar1;
    Qiniu_Free(addr_00);
    QVar2._4_4_ = 0;
    QVar2.code = Qiniu_OK.code;
    QVar2.message = Qiniu_OK.message;
  }
  return QVar2;
}

Assistant:

static Qiniu_Error Qiniu_Mac_Auth(
	void *self, Qiniu_Header **header, const char *url, const char *addition, size_t addlen)
{
	Qiniu_Error err;
	char *auth;
	char *enc_digest;
	char digest[EVP_MAX_MD_SIZE + 1];
	unsigned int digest_len = sizeof(digest);
	Qiniu_Mac mac;

	char const *path;
	err = Qiniu_Mac_Parse_Url(url, NULL, NULL, &path, NULL);
	if (err.code != 200)
	{
		return err;
	}

	if (self)
	{
		mac = *(Qiniu_Mac *)self;
	}
	else
	{
		mac.accessKey = QINIU_ACCESS_KEY;
		mac.secretKey = QINIU_SECRET_KEY;
	}
	Qiniu_Mac_Hmac(&mac, path, addition, addlen, digest, &digest_len);
	enc_digest = Qiniu_Memory_Encode(digest, digest_len);

	auth = Qiniu_String_Concat("Authorization: QBox ", mac.accessKey, ":", enc_digest, NULL);
	Qiniu_Free(enc_digest);

	*header = curl_slist_append(*header, auth);
	Qiniu_Free(auth);

	return Qiniu_OK;
}